

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qjsonobject.cpp
# Opt level: O0

QJsonValue * __thiscall QJsonObject::takeImpl<QLatin1String>(QJsonObject *this,QLatin1String key)

{
  QLatin1String key_00;
  bool bVar1;
  undefined8 in_RSI;
  QJsonValue *in_RDI;
  long in_FS_OFFSET;
  qsizetype index;
  QJsonValue *v;
  bool keyExists;
  Type type;
  QJsonValue *in_stack_ffffffffffffff88;
  QExplicitlySharedDataPointer<QCborContainerPrivate> *in_stack_ffffffffffffff90;
  qsizetype in_stack_fffffffffffffff0;
  char *pcVar2;
  
  type = (Type)((ulong)in_RSI >> 0x20);
  pcVar2 = *(char **)(in_FS_OFFSET + 0x28);
  bVar1 = QExplicitlySharedDataPointer<QCborContainerPrivate>::operator!
                    ((QExplicitlySharedDataPointer<QCborContainerPrivate> *)0x494a3f);
  if (bVar1) {
    QJsonValue::QJsonValue(in_stack_ffffffffffffff88,type);
  }
  else {
    key_00.m_data = pcVar2;
    key_00.m_size = in_stack_fffffffffffffff0;
    indexOf<QLatin1String>(in_stack_ffffffffffffff90,key_00,(bool *)in_stack_ffffffffffffff88);
    QJsonValue::QJsonValue(in_stack_ffffffffffffff88,type);
  }
  if (*(char **)(in_FS_OFFSET + 0x28) != pcVar2) {
    __stack_chk_fail();
  }
  return in_RDI;
}

Assistant:

QJsonValue QJsonObject::takeImpl(T key)
{
    if (!o)
        return QJsonValue(QJsonValue::Undefined);

    bool keyExists;
    auto index = indexOf(o, key, &keyExists);
    if (!keyExists)
        return QJsonValue(QJsonValue::Undefined);

    detach();
    const QJsonValue v = QJsonPrivate::Value::fromTrustedCbor(o->extractAt(index + 1));
    removeAt(index);
    return v;
}